

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demo6502.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  DemoM6502 local_38e0;
  
  DemoM6502::DemoM6502(&local_38e0);
  local_38e0.super_PixelGameEngine.bPixelCohesion = false;
  local_38e0.super_PixelGameEngine.vScreenSize.x = 0x30c;
  local_38e0.super_PixelGameEngine.vScreenSize.y = 0x1e0;
  local_38e0.super_PixelGameEngine.vInvScreenSize.x = 0.0012820513;
  local_38e0.super_PixelGameEngine.vInvScreenSize.y = 0.0020833334;
  local_38e0.super_PixelGameEngine.vPixelSize.x = 2;
  local_38e0.super_PixelGameEngine.vPixelSize.y = 2;
  local_38e0.super_PixelGameEngine.vWindowSize.x = 0x618;
  local_38e0.super_PixelGameEngine.vWindowSize.y = 0x3c0;
  local_38e0.super_PixelGameEngine.bFullScreen = false;
  local_38e0.super_PixelGameEngine.bEnableVSYNC = false;
  local_38e0.super_PixelGameEngine.vPixel.x = 0.0;
  local_38e0.super_PixelGameEngine.vPixel.y = 0.0;
  olc::PixelGameEngine::Start(&local_38e0.super_PixelGameEngine);
  DemoM6502::~DemoM6502(&local_38e0);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
  DemoM6502 demo;
  demo.Construct(780, 480, 2, 2);
  demo.Start();
  return 0;
}